

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O2

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,FunctionBody *functionRead,uint startOffset,bool useOriginalByteCode)

{
  SmallSpanSequence *statementMap;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteBlock *this_00;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *fullstatementMap;
  byte *byteCodeStart;
  
  if (functionRead == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x57,"(functionRead != nullptr)",
                                "Must provide valid function to execute");
    if (!bVar2) goto LAB_007de2bf;
    *puVar3 = 0;
  }
  if (useOriginalByteCode) {
    this_00 = FunctionBody::GetOriginalByteCode(functionRead);
  }
  else {
    this_00 = FunctionBody::GetByteCode(functionRead);
  }
  if (this_00 == (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x5d,"(pblkByteCode != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar2) {
LAB_007de2bf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  statementMap = (functionRead->m_sourceInfo).pSpanSequence;
  if (statementMap == (SmallSpanSequence *)0x0) {
    bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)functionRead);
    if (bVar2) {
      fullstatementMap =
           (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                        ((FunctionProxy *)functionRead);
      goto LAB_007de296;
    }
  }
  fullstatementMap =
       (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
LAB_007de296:
  byteCodeStart = ByteBlock::GetBuffer(this_00);
  Create(this,byteCodeStart,startOffset,statementMap,fullstatementMap);
  return;
}

Assistant:

void StatementReader<FunctionBody::StatementMapList>::Create(FunctionBody* functionRead, uint startOffset, bool useOriginalByteCode)
    {
        AssertMsg(functionRead != nullptr, "Must provide valid function to execute");

        ByteBlock * pblkByteCode = useOriginalByteCode ?
            functionRead->GetOriginalByteCode() :
            functionRead->GetByteCode();

        AssertMsg(pblkByteCode != nullptr, "Must have valid byte-code to read");

        SmallSpanSequence* statementMap = functionRead->GetStatementMapSpanSequence();
        FunctionBody::StatementMapList* fullMap = nullptr;
        if (statementMap == nullptr && functionRead->IsInDebugMode())
        {
            fullMap = functionRead->GetStatementMaps();
        }
        Create(pblkByteCode->GetBuffer(), startOffset, statementMap, fullMap);
    }